

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *this,cmTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  string *__return_storage_ptr___00;
  bool bVar1;
  string local_150;
  undefined1 local_12a;
  allocator local_129;
  string local_128;
  string local_108;
  TargetType local_e4;
  undefined4 local_e0;
  TargetType targetType;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string pdbSupportVar;
  string language;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  cmTarget *target_local;
  string *result;
  
  __return_storage_ptr___00 = (string *)((long)&pdbSupportVar.field_2 + 8);
  cmTarget::GetLinkerLanguage
            (__return_storage_ptr___00,(cmTarget *)this,
             (string *)&(target->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header);
  std::operator+(&local_88,"CMAKE_",__return_storage_ptr___00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,"_LINKER_SUPPORTS_PDB");
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = cmMakefile::IsOn(*(cmMakefile **)&(target->DebugCompatiblePropertiesDone)._M_t._M_impl,
                           (string *)local_68);
  if (bVar1) {
    local_e4 = cmTarget::GetType((cmTarget *)this);
    if (((local_e4 == SHARED_LIBRARY) || (local_e4 == MODULE_LIBRARY)) || (local_e4 == EXECUTABLE))
    {
      local_12a = 0;
      cmTarget::GetPDBDirectory
                (__return_storage_ptr__,(cmTarget *)this,
                 (string *)
                 &(target->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      cmTarget::GetPDBName
                (&local_150,(cmTarget *)this,
                 (string *)
                 &(target->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      local_12a = 1;
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_108,(GeneratorExpressionContent *)context);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_128,
                 "TARGET_PDB_FILE is allowed only for targets with linker created artifacts.",
                 &local_129);
      reportError((cmGeneratorExpressionContext *)target,&local_108,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b8,(GeneratorExpressionContent *)context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,"TARGET_PDB_FILE is not supported by the target linker.",
               (allocator *)((long)&targetType + 3));
    reportError((cmGeneratorExpressionContext *)target,&local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&targetType + 3));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  local_e0 = 1;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(pdbSupportVar.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmTarget* target,
                            cmGeneratorExpressionContext *context,
                            const GeneratorExpressionContent *content)
  {
    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if(!context->Makefile->IsOn(pdbSupportVar))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is not supported by the target linker.");
      return std::string();
      }

    cmTarget::TargetType targetType = target->GetType();

    if(targetType != cmTarget::SHARED_LIBRARY &&
       targetType != cmTarget::MODULE_LIBRARY &&
       targetType != cmTarget::EXECUTABLE)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
      }

    std::string result = target->GetPDBDirectory(context->Config);
    result += "/";
    result += target->GetPDBName(context->Config);
    return result;
  }